

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadContactSurfaceMesh.h
# Opt level: O1

ChLoadContactSurfaceMesh * __thiscall
chrono::fea::ChLoadContactSurfaceMesh::Clone(ChLoadContactSurfaceMesh *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ChLoadContactSurfaceMesh *this_00;
  
  this_00 = (ChLoadContactSurfaceMesh *)::operator_new(0x68);
  ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  (this_00->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoadBase_00b48a58;
  (this_00->super_ChLoadBase).jacobians = (this->super_ChLoadBase).jacobians;
  (this_00->super_ChLoadBase).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadContactSurfaceMesh_00b52888;
  (this_00->contactmesh).
  super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->contactmesh).
       super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->contactmesh).
           super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this_00->contactmesh).
  super___shared_ptr<chrono::fea::ChContactSurfaceMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<chrono::ChLoadXYZnode>,_std::allocator<std::shared_ptr<chrono::ChLoadXYZnode>_>_>
  ::vector(&this_00->forces,&this->forces);
  return this_00;
}

Assistant:

virtual ChLoadContactSurfaceMesh* Clone() const override { return new ChLoadContactSurfaceMesh(*this); }